

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,IfStatement *statement)

{
  int iVar1;
  Value *pVVar2;
  reference pvVar3;
  int local_4c;
  long local_48;
  size_t index_2;
  long local_38;
  size_t index_1;
  long local_28;
  size_t index;
  IfStatement *local_18;
  IfStatement *statement_local;
  NewFunctionProcessingVisitor *this_local;
  
  local_18 = statement;
  statement_local = (IfStatement *)this;
  if (statement->else_statement_ == (Statement *)0x0) {
    pVVar2 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&statement->expression_->super_Node);
    iVar1 = (*pVVar2->_vptr_Value[2])();
    if (iVar1 != 0) {
      TraverseToChildByIndex(this);
      index._4_4_ = 0;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                (&this->offsets_,(value_type *)((long)&index + 4));
      FrameEmulator::AllocScope(&this->frame_);
      FunctionTable::BeginScope(&this->table_);
      (**(local_18->if_statement_->super_Node)._vptr_Node)(local_18->if_statement_,this);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
      pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->offsets_);
      local_28 = (long)*pvVar3;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
      index_1._4_4_ = (int)local_28 + 1;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                (&this->offsets_,(value_type *)((long)&index_1 + 4));
      this->current_layer_ = this->current_layer_->parent_;
      FrameEmulator::DeallocScope(&this->frame_);
      FunctionTable::EndScope(&this->table_);
    }
  }
  else {
    pVVar2 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&statement->expression_->super_Node);
    iVar1 = (*pVVar2->_vptr_Value[2])();
    if (iVar1 == 0) {
      TraverseToChildByIndex(this);
      index_2._0_4_ = 0;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                (&this->offsets_,(value_type *)&index_2);
      FrameEmulator::AllocScope(&this->frame_);
      FunctionTable::BeginScope(&this->table_);
      (**(local_18->else_statement_->super_Node)._vptr_Node)(local_18->else_statement_,this);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
      pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->offsets_);
      local_48 = (long)*pvVar3;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
      local_4c = (int)local_48 + 2;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->offsets_,&local_4c);
      this->current_layer_ = this->current_layer_->parent_;
      FrameEmulator::DeallocScope(&this->frame_);
      FunctionTable::EndScope(&this->table_);
    }
    else {
      TraverseToChildByIndex(this);
      index_1._0_4_ = 0;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                (&this->offsets_,(value_type *)&index_1);
      FrameEmulator::AllocScope(&this->frame_);
      FunctionTable::BeginScope(&this->table_);
      (**(local_18->if_statement_->super_Node)._vptr_Node)(local_18->if_statement_,this);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
      pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->offsets_);
      local_38 = (long)*pvVar3;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
      index_2._4_4_ = (int)local_38 + 2;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                (&this->offsets_,(value_type *)((long)&index_2 + 4));
      this->current_layer_ = this->current_layer_->parent_;
      FrameEmulator::DeallocScope(&this->frame_);
      FunctionTable::EndScope(&this->table_);
    }
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(IfStatement* statement) {
  if (statement->else_statement_ == nullptr) {
    if (Accept(statement->expression_)->GetValue()) {
      TraverseToChildByIndex();

      offsets_.push(0);
      frame_.AllocScope();
      table_.BeginScope();

      statement->if_statement_->Accept(this);

      offsets_.pop();
      size_t index = offsets_.top();
      offsets_.pop();
      offsets_.push(index + 1);

      current_layer_ = current_layer_->parent_;

      frame_.DeallocScope();
      table_.EndScope();
    }
  } else {
    if (Accept(statement->expression_)->GetValue()) {
      TraverseToChildByIndex();

      offsets_.push(0);
      frame_.AllocScope();
      table_.BeginScope();

      statement->if_statement_->Accept(this);

      offsets_.pop();
      size_t index = offsets_.top();
      offsets_.pop();
      offsets_.push(index + 2);

      current_layer_ = current_layer_->parent_;

      frame_.DeallocScope();
      table_.EndScope();
    } else {
      TraverseToChildByIndex();

      offsets_.push(0);
      frame_.AllocScope();
      table_.BeginScope();

      statement->else_statement_->Accept(this);

      offsets_.pop();
      size_t index = offsets_.top();
      offsets_.pop();
      offsets_.push(index + 2);

      current_layer_ = current_layer_->parent_;

      frame_.DeallocScope();
      table_.EndScope();
    }
  }
}